

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlTextReaderSetErrorHandler(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  xmlTextReaderPyCtxtPtr local_68;
  PyObject *py_retval;
  PyObject *pyobj_arg;
  PyObject *pyobj_f;
  PyObject *pyobj_reader;
  void *arg;
  xmlTextReaderErrorFunc f;
  xmlTextReaderPyCtxtPtr pyCtxt;
  xmlTextReaderPtr reader;
  PyObject *args_local;
  PyObject *self_local;
  
  reader = (xmlTextReaderPtr)args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"OOO:xmlTextReaderSetErrorHandler",&pyobj_f,&pyobj_arg,&py_retval);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (pyobj_f == (PyObject *)&_Py_NoneStruct) {
      local_68 = (xmlTextReaderPyCtxtPtr)0x0;
    }
    else {
      local_68 = (xmlTextReaderPyCtxtPtr)pyobj_f[1].ob_refcnt;
    }
    pyCtxt = local_68;
    xmlTextReaderGetErrorHandler(local_68,&arg,&pyobj_reader);
    if (pyobj_reader != (PyObject *)0x0) {
      if ((code *)arg != libxml_xmlTextReaderErrorCallback) {
        pPVar2 = libxml_intWrap(-1);
        return pPVar2;
      }
      f = (xmlTextReaderErrorFunc)pyobj_reader;
      _Py_XDECREF((PyObject *)pyobj_reader->ob_refcnt);
      _Py_XDECREF(*(PyObject **)(f + 8));
      (*_xmlFree)(f);
    }
    xmlTextReaderSetErrorHandler(pyCtxt,0);
    if (pyobj_arg != (PyObject *)&_Py_NoneStruct) {
      f = (xmlTextReaderErrorFunc)(*_xmlMalloc)(0x10);
      if (f == (xmlTextReaderErrorFunc)0x0) {
        pPVar2 = libxml_intWrap(-1);
        return pPVar2;
      }
      _Py_XINCREF(pyobj_arg);
      *(PyObject **)f = pyobj_arg;
      _Py_XINCREF(py_retval);
      *(PyObject **)(f + 8) = py_retval;
      xmlTextReaderSetErrorHandler(pyCtxt,libxml_xmlTextReaderErrorCallback,f);
    }
    self_local = libxml_intWrap(1);
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_xmlTextReaderSetErrorHandler(ATTRIBUTE_UNUSED PyObject *self, PyObject *args)
{
    xmlTextReaderPtr reader;
    xmlTextReaderPyCtxtPtr pyCtxt;
    xmlTextReaderErrorFunc f;
    void *arg;
    PyObject *pyobj_reader;
    PyObject *pyobj_f;
    PyObject *pyobj_arg;
    PyObject *py_retval;

    if (!PyArg_ParseTuple(args, (char *)"OOO:xmlTextReaderSetErrorHandler", &pyobj_reader, &pyobj_f, &pyobj_arg))
        return(NULL);
    reader = (xmlTextReaderPtr) PyxmlTextReader_Get(pyobj_reader);
    /* clear previous error handler */
    xmlTextReaderGetErrorHandler(reader,&f,&arg);
    if (arg != NULL) {
	if (f == (xmlTextReaderErrorFunc) libxml_xmlTextReaderErrorCallback) {
	    /* ok, it's our error handler! */
	    pyCtxt = (xmlTextReaderPyCtxtPtr)arg;
	    Py_XDECREF(pyCtxt->f);
	    Py_XDECREF(pyCtxt->arg);
	    xmlFree(pyCtxt);
	}
	else {
	    /* 
	     * there already an arg, and it's not ours,
	     * there is definitely something wrong going on here...
	     * we don't know how to free it, so we bail out... 
	     */
	    py_retval = libxml_intWrap(-1);
	    return(py_retval);
	}
    }
    xmlTextReaderSetErrorHandler(reader,NULL,NULL);
    /* set new error handler */
    if (pyobj_f != Py_None)
    {
	pyCtxt = (xmlTextReaderPyCtxtPtr)xmlMalloc(sizeof(xmlTextReaderPyCtxt));
	if (pyCtxt == NULL) {
	    py_retval = libxml_intWrap(-1);
	    return(py_retval);
	}
	Py_XINCREF(pyobj_f);
	pyCtxt->f = pyobj_f;
	Py_XINCREF(pyobj_arg);
	pyCtxt->arg = pyobj_arg;
	xmlTextReaderSetErrorHandler(reader,
	                             libxml_xmlTextReaderErrorCallback,
	                             pyCtxt);
    }

    py_retval = libxml_intWrap(1);
    return(py_retval);
}